

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<512UL>,_void>
::to_json(json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<512UL>,_void>
          *this,bitset<512UL> *val,allocator_type *alloc)

{
  byte bVar1;
  pointer phVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  size_t i;
  ulong uVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar5;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  byte local_49;
  char_type_conflict1 *local_48;
  iterator iStack_40;
  uchar *local_38;
  
  local_48 = (char_type_conflict1 *)0x0;
  iStack_40._M_current = (uchar *)0x0;
  local_38 = (uchar *)0x0;
  local_49 = 0;
  bVar1 = 0x80;
  uVar4 = 0;
  do {
    if (((val->super__Base_bitset<8UL>)._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
      local_49 = local_49 | bVar1;
    }
    if (bVar1 < 2) {
      if (iStack_40._M_current == local_38) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,iStack_40,
                   &local_49);
      }
      else {
        *iStack_40._M_current = local_49;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      local_49 = 0;
      bVar1 = 0x80;
    }
    else {
      bVar1 = bVar1 >> 1;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x200);
  if (iStack_40._M_current == local_38) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,iStack_40,&local_49)
    ;
  }
  else {
    *iStack_40._M_current = local_49;
    iStack_40._M_current = iStack_40._M_current + 1;
  }
  phVar2 = utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::create
                     (local_48,(long)iStack_40._M_current - (long)local_48,0,alloc);
  *(undefined2 *)this = 0x80c;
  *(pointer *)(this + 8) = phVar2;
  uVar3 = extraout_RDX;
  if (local_48 != (char_type_conflict1 *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
    uVar3 = extraout_RDX_00;
  }
  bVar5.field_0.int64_.val_ = uVar3;
  bVar5.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar5.field_0;
}

Assistant:

static Json to_json(const std::bitset<N>& val, 
                            const allocator_type& alloc = allocator_type())
        {
            std::vector<uint8_t> bits;

            uint8_t byte = 0;
            uint8_t mask = 0x80;

            for (std::size_t i = 0; i < N; ++i)
            {
                if (val[i])
                {
                    byte |= mask;
                }

                mask = static_cast<uint8_t>(mask >> 1);

                if (mask == 0)
                {
                    bits.push_back(byte);
                    byte = 0;
                    mask = 0x80;
                }
            }

            // Encode remainder
            if (mask != 0x80)
            {
                bits.push_back(byte);
            }

            Json j(byte_string_arg, bits, semantic_tag::base16, alloc);
            return j;
        }